

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void copy_termchar(termline *destline,wchar_t x,termchar *src)

{
  truecolour *ptVar1;
  termchar *ptVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  undefined8 uVar5;
  wchar_t wVar6;
  long lVar7;
  
  clear_cc(destline,x);
  ptVar2 = destline->chars;
  uVar3 = src->chr;
  uVar4 = src->attr;
  uVar5 = *(undefined8 *)&src->cc_next;
  ptVar1 = &ptVar2[x].truecolour;
  *ptVar1 = src->truecolour;
  ptVar1[1] = (truecolour)uVar5;
  ptVar2 = ptVar2 + x;
  ptVar2->chr = uVar3;
  ptVar2->attr = uVar4;
  destline->chars[x].cc_next = L'\0';
  wVar6 = src->cc_next;
  while (wVar6 != L'\0') {
    lVar7 = (long)wVar6;
    add_cc(destline,x,src[wVar6].chr);
    wVar6 = src[wVar6].cc_next;
    src = src + lVar7;
  }
  return;
}

Assistant:

static void copy_termchar(termline *destline, int x, termchar *src)
{
    clear_cc(destline, x);

    destline->chars[x] = *src;         /* copy everything except cc-list */
    destline->chars[x].cc_next = 0;    /* and make sure this is zero */

    while (src->cc_next) {
        src += src->cc_next;
        add_cc(destline, x, src->chr);
    }

#ifdef TERM_CC_DIAGS
    cc_check(destline);
#endif
}